

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O3

void test9(void)

{
  Task *pTVar1;
  int iVar2;
  Workitem *this;
  Task *itask;
  undefined8 *puVar3;
  ostream *poVar4;
  int iVar5;
  int (*paiVar6) [32];
  int (*paiVar7) [32];
  long lVar8;
  Ignore<int_&> local_40;
  int (*local_38) [32];
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    paiVar6 = mx;
    lVar8 = 0;
    paiVar7 = mx;
    do {
      local_40.t_ = (int *)0x0;
      local_38 = paiVar6;
      iVar2 = depspawn::internal::
              fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int,int&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                        ((arg_info **)&local_40,&nthreads,*paiVar6);
      if ((depspawn::internal::TP == (Task *)0x0) ||
         (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
        depspawn::internal::start_master();
      }
      this = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                       ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                        depspawn::internal::Workitem::Pool);
      depspawn::internal::Workitem::Workitem(this,(arg_info *)local_40.t_,iVar2);
      pTVar1 = depspawn::internal::TP;
      itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                        ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                         &depspawn::internal::TP[9].next);
      *(undefined8 *)&(itask->func_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
      (itask->func_).super__Function_base._M_manager = (_Manager_type)0x0;
      (itask->func_)._M_invoker = (_Invoker_type)0x0;
      puVar3 = (undefined8 *)operator_new(0x18);
      *puVar3 = depprev;
      puVar3[1] = paiVar7;
      puVar3[2] = &nthreads;
      *(undefined8 **)&(itask->func_).super__Function_base._M_functor = puVar3;
      (itask->func_)._M_invoker =
           std::
           _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int,_int_&)>_>
           ::_M_invoke;
      (itask->func_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int,_int_&)>_>
           ::_M_manager;
      itask->ctx_ = this;
      itask->next = pTVar1;
      depspawn::internal::Workitem::insert_in_worklist(this,itask);
      lVar8 = lVar8 + 1;
      paiVar7 = paiVar7 + 1;
      paiVar6 = local_38 + 1;
    } while (lVar8 < nsize);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    paiVar6 = mx;
    lVar8 = 0;
    iVar2 = nsize;
    iVar5 = nthreads;
    do {
      if ((*paiVar6)[0] != iVar5 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
        std::ostream::operator<<(poVar4,(*paiVar6)[0]);
        retstate = -1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error\n",6);
        iVar2 = nsize;
        iVar5 = nthreads;
      }
      (*paiVar6)[0] = 0;
      lVar8 = lVar8 + 1;
      paiVar6 = paiVar6 + 1;
    } while (lVar8 < iVar2);
  }
  pr("f(const_var, diff_int&)");
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    paiVar6 = mx;
    lVar8 = 0;
    do {
      depspawn::spawn<void(int,int&),int,int&>(depprev,&nthreads,*paiVar6);
      lVar8 = lVar8 + 1;
      paiVar6 = paiVar6 + 1;
    } while (lVar8 < nsize);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    paiVar6 = mx;
    lVar8 = 0;
    iVar2 = nsize;
    iVar5 = nthreads;
    do {
      if ((*paiVar6)[0] != iVar5 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
        std::ostream::operator<<(poVar4,(*paiVar6)[0]);
        retstate = -1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error\n",6);
        iVar2 = nsize;
        iVar5 = nthreads;
      }
      (*paiVar6)[0] = 0;
      lVar8 = lVar8 + 1;
      paiVar6 = paiVar6 + 1;
    } while (lVar8 < iVar2);
  }
  pr("f(frozen const_var, diff_int&)");
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    paiVar6 = mx;
    lVar8 = 0;
    do {
      local_40.t_ = &nthreads;
      depspawn::spawn<void(int,int&),depspawn::Ignore<int&>,int&>(depprev,&local_40,*paiVar6);
      lVar8 = lVar8 + 1;
      paiVar6 = paiVar6 + 1;
    } while (lVar8 < nsize);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    paiVar6 = mx;
    lVar8 = 0;
    iVar2 = nsize;
    iVar5 = nthreads;
    do {
      if ((*paiVar6)[0] != iVar5 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
        std::ostream::operator<<(poVar4,(*paiVar6)[0]);
        retstate = -1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error\n",6);
        iVar2 = nsize;
        iVar5 = nthreads;
      }
      (*paiVar6)[0] = 0;
      lVar8 = lVar8 + 1;
      paiVar6 = paiVar6 + 1;
    } while (lVar8 < iVar2);
  }
  pr("f(ignore(const_var), diff_int&)");
  return;
}

Assistant:

void test9()
{
  
  //V1: just use it "as is"
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, nthreads, mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(const_var, diff_int&)");
  
  //V2: Freeze it
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, std::move(nthreads), mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(frozen const_var, diff_int&)");
  
  //V3: Ignore it
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, ignore(nthreads), mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(ignore(const_var), diff_int&)");
}